

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O0

Prog * __thiscall re2::RE2::ReverseProg(RE2 *this)

{
  anon_class_8_1_8991fb9c local_18;
  RE2 *local_10;
  RE2 *this_local;
  
  local_18.this = this;
  local_10 = this;
  std::call_once<re2::RE2::ReverseProg()const::__0>(&this->rprog_once_,&local_18);
  return this->rprog_;
}

Assistant:

re2::Prog* RE2::ReverseProg() const {
  std::call_once(rprog_once_, [this]() {
    rprog_ = suffix_regexp_->CompileToReverseProg(options_.max_mem()/3);
    if (rprog_ == NULL) {
      if (options_.log_errors())
        LOG(ERROR) << "Error reverse compiling '" << trunc(pattern_) << "'";
      error_ = new string("pattern too large - reverse compile failed");
      error_code_ = RE2::ErrorPatternTooLarge;
    }
  });
  return rprog_;
}